

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *paVar1;
  long lVar2;
  art_val_t *__ptr;
  byte type2;
  int iVar3;
  int *c;
  int *piVar4;
  ulong uVar5;
  uint8_t uVar6;
  ulong uVar7;
  art_iterator_t *iterator;
  bool bVar8;
  uint8_t typecode2;
  art_iterator_t it2;
  art_iterator_t it1;
  uint8_t local_151 [9];
  roaring64_bitmap_t *local_148;
  art_iterator_t local_140;
  art_iterator_t local_b8;
  
  local_148 = r1;
  art_init_iterator(&local_b8,&r1->art,true);
  art_init_iterator(&local_140,&r2->art,true);
  paVar1 = local_140.value;
  do {
    if (local_b8.value == (art_val_t *)0x0) {
      return;
    }
    iVar3 = 0;
    local_140.value = paVar1;
    if ((paVar1 != (art_val_t *)0x0) &&
       (iVar3 = art_compare_keys(local_b8.key,local_140.key), __ptr = local_b8.value, iVar3 == 0)) {
      piVar4 = *(int **)(local_b8.value[1].key + 2);
      type2 = local_140.value[1].key[0];
      if (local_b8.value[1].key[0] != 4) {
        if (type2 == 4) {
          type2 = *(byte *)((long)*(container_t **)(local_140.value[1].key + 2) + 8);
        }
        local_151[1] = '\0';
        local_151[2] = '\0';
        local_151[3] = '\0';
        local_151[4] = '\0';
        local_151[5] = '\0';
        local_151[6] = '\0';
        local_151[7] = '\0';
        local_151[8] = '\0';
        (*(code *)(&DAT_00135de4 +
                  *(int *)(&DAT_00135de4 +
                          (ulong)(((uint)type2 + (uint)local_b8.value[1].key[0] * 4) - 5) * 4)))();
        return;
      }
      c = (int *)container_andnot(piVar4,'\x04',*(container_t **)(local_140.value[1].key + 2),type2,
                                  local_151);
      if (c != piVar4) {
        container_free(piVar4,'\x04');
        *(int **)(__ptr[1].key + 2) = c;
        __ptr[1].key[0] = local_151[0];
      }
      piVar4 = c;
      uVar6 = local_151[0];
      if (local_151[0] == '\x04') {
        uVar6 = (uint8_t)c[2];
        piVar4 = *(int **)c;
      }
      iVar3 = *piVar4;
      if ((uVar6 == '\x03') || (uVar6 == '\x02')) {
        bVar8 = 0 < iVar3;
      }
      else {
        if (iVar3 == -1) {
          if (**(long **)(piVar4 + 2) == 0) {
            uVar5 = 0xffffffffffffffff;
            do {
              if (uVar5 == 0x3fe) {
                uVar7 = 0x3ff;
                break;
              }
              uVar7 = uVar5 + 1;
              lVar2 = uVar5 + 2;
              uVar5 = uVar7;
            } while ((*(long **)(piVar4 + 2))[lVar2] == 0);
            bVar8 = 0x3fe < uVar7;
          }
          else {
            bVar8 = false;
          }
        }
        else {
          bVar8 = iVar3 == 0;
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      if (bVar8) {
        art_iterator_next(&local_b8);
      }
      else {
        container_free(c,local_151[0]);
        art_iterator_erase(&local_148->art,&local_b8);
        roaring_free(__ptr);
      }
      art_iterator_next(&local_140);
      iVar3 = 0;
    }
    iterator = &local_b8;
    if ((iVar3 < 0 || paVar1 == (art_val_t *)0x0) ||
       (iterator = &local_140, paVar1 = local_140.value, 0 < iVar3)) {
      art_iterator_next(iterator);
      paVar1 = local_140.value;
    }
  } while( true );
}

Assistant:

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,
                                     const roaring64_bitmap_t *r2) {
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> it1++
        // 2. it1_present &&  it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                container_t *container1 = leaf1->container;
                uint8_t typecode1 = leaf1->typecode;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_andnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                    if (container2 != container1) {
                        // We only free when doing container_andnot, not
                        // container_iandnot, as iandnot frees the original
                        // internally.
                        container_free(container1, typecode1);
                    }
                } else {
                    container2 = container_iandnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != container1) {
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }

                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&r1->art, &it1);
                    free_leaf(leaf1);
                } else {
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
}